

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall ImFontAtlas::AddFontDefault(ImFontAtlas *this,ImFontConfig *font_cfg_template)

{
  ImFont *pIVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int compressed_ttf_size;
  ImWchar *glyph_ranges;
  ImFontConfig IStack_98;
  
  if (font_cfg_template == (ImFontConfig *)0x0) {
    memset(&IStack_98,0,0x88);
    IStack_98.FontDataOwnedByAtlas = true;
    IStack_98.GlyphMaxAdvanceX = 3.4028235e+38;
    IStack_98.RasterizerMultiply = 1.0;
    IStack_98.EllipsisChar = 0xffff;
    IStack_98.OversampleH = 1;
    IStack_98.OversampleV = 1;
    IStack_98.PixelSnapH = true;
    compressed_ttf_size = extraout_EDX_00;
  }
  else {
    memcpy(&IStack_98,font_cfg_template,0x88);
    compressed_ttf_size = extraout_EDX;
    if (0.0 < IStack_98.SizePixels) goto LAB_001cfdab;
  }
  IStack_98.SizePixels = 20.0;
LAB_001cfdab:
  if (IStack_98.Name[0] == '\0') {
    ImFormatString(IStack_98.Name,0x28,"Roboto-Medium.ttf, %dpx",
                   (ulong)(uint)(int)IStack_98.SizePixels);
    compressed_ttf_size = extraout_EDX_01;
  }
  IStack_98.EllipsisChar = 0x85;
  IStack_98.GlyphOffset.y = (float)(int)(IStack_98.SizePixels / 13.0);
  glyph_ranges = GetGlyphRangesDefault::ranges;
  if (IStack_98.GlyphRanges != (ImWchar *)0x0) {
    glyph_ranges = IStack_98.GlyphRanges;
  }
  pIVar1 = AddFontFromMemoryCompressedTTF
                     (this,roboto_medium_compressed_data,compressed_ttf_size,IStack_98.SizePixels,
                      &IStack_98,glyph_ranges);
  return pIVar1;
}

Assistant:

ImFont* ImFontAtlas::AddFontDefault(const ImFontConfig* font_cfg_template)
{
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (!font_cfg_template)
    {
        font_cfg.OversampleH = font_cfg.OversampleV = 1;
        font_cfg.PixelSnapH = true;
    }
    if (font_cfg.SizePixels <= 0.0f)
        font_cfg.SizePixels = 20.0f * 1.0f;
    if (font_cfg.Name[0] == '\0')
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "Roboto-Medium.ttf, %dpx", (int)font_cfg.SizePixels);
    font_cfg.EllipsisChar = (ImWchar)0x0085;
    font_cfg.GlyphOffset.y = 1.0f * IM_FLOOR(font_cfg.SizePixels / 13.0f);  // Add +1 offset per 13 units

    const ImWchar* glyph_ranges = font_cfg.GlyphRanges != NULL ? font_cfg.GlyphRanges : GetGlyphRangesDefault();
    ImFont* font = AddFontFromMemoryCompressedTTF((void*)roboto_medium_compressed_data,
            roboto_medium_compressed_size, font_cfg.SizePixels, &font_cfg, glyph_ranges);
    return font;
}